

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BranchLayerParams::CopyFrom(BranchLayerParams *this,BranchLayerParams *from)

{
  if (from != this) {
    if (this->ifbranch_ != (NeuralNetwork *)0x0) {
      (*(this->ifbranch_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->ifbranch_ = (NeuralNetwork *)0x0;
    if (this->elsebranch_ != (NeuralNetwork *)0x0) {
      (*(this->elsebranch_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->elsebranch_ = (NeuralNetwork *)0x0;
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void BranchLayerParams::CopyFrom(const BranchLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.BranchLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}